

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryLayeredRenderingTests.cpp
# Opt level: O1

TestCaseGroup * vkt::geometry::createLayeredRenderingTests(TestContext *testCtx)

{
  undefined4 uVar1;
  TestContext *testCtx_00;
  undefined8 uVar2;
  TestNode *this;
  char *__s;
  TestNode *node;
  long lVar3;
  long lVar4;
  string s;
  allocator<char> local_a9;
  TestNode *local_a8;
  string local_a0;
  long *local_80 [2];
  long local_70 [2];
  string local_60;
  TestContext *local_40;
  long local_38;
  
  local_a8 = (TestNode *)operator_new(0x70);
  local_40 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_a8,testCtx,"layered","Layered rendering tests.");
  lVar4 = 0;
  do {
    this = (TestNode *)operator_new(0x70);
    __s = ::vk::getImageViewTypeName((&DAT_00b70530)[lVar4 * 5]);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_80,__s,(allocator<char> *)&local_a0);
    std::__cxx11::string::substr((ulong)&local_a0,(ulong)local_80);
    de::toLower(&local_60,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,local_40,local_60._M_dataplus._M_p,"");
    local_38 = lVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    lVar3 = 0x10;
    do {
      uVar1 = *(undefined4 *)((long)&PTR_typeinfo_00d49270 + lVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_80,*(char **)(&UNK_00d49278 + lVar3),(allocator<char> *)&local_60);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,*(char **)((long)&DAT_00d49280 + lVar3),&local_a9);
      testCtx_00 = this->m_testCtx;
      node = (TestNode *)operator_new(0x98);
      tcu::TestCase::TestCase
                ((TestCase *)node,testCtx_00,NODETYPE_SELF_VALIDATE,(char *)local_80[0],
                 local_a0._M_dataplus._M_p);
      node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d49338;
      node[1]._vptr_TestNode = (_func_int **)anon_unknown_0::initPrograms;
      node[1].m_testCtx = (TestContext *)anon_unknown_0::test;
      *(undefined4 *)&node[1].m_name._M_dataplus._M_p = uVar1;
      uVar2 = *(undefined8 *)(&UNK_00b70538 + lVar4 * 0x14);
      *(undefined8 *)((long)&node[1].m_name._M_dataplus._M_p + 4) =
           *(undefined8 *)(&DAT_00b70530 + lVar4 * 5);
      *(undefined8 *)((long)&node[1].m_name._M_string_length + 4) = uVar2;
      *(undefined4 *)((long)&node[1].m_name.field_2 + 4) = (&DAT_00b70540)[lVar4 * 5];
      tcu::TestNode::addChild(this,node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0xb8);
    tcu::TestNode::addChild(local_a8,this);
    lVar4 = local_38 + 1;
  } while (lVar4 != 5);
  return (TestCaseGroup *)local_a8;
}

Assistant:

tcu::TestCaseGroup* createLayeredRenderingTests (tcu::TestContext& testCtx)
{
	MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "layered", "Layered rendering tests."));

	const struct
	{
		TestType		test;
		const char*		name;
		const char*		description;
	} testTypes[] =
	{
		{ TEST_TYPE_DEFAULT_LAYER,					"render_to_default_layer",			"Render to the default layer"															},
		{ TEST_TYPE_SINGLE_LAYER,					"render_to_one",					"Render to one layer"																	},
		{ TEST_TYPE_ALL_LAYERS,						"render_to_all",					"Render to all layers"																	},
		{ TEST_TYPE_DIFFERENT_CONTENT,				"render_different_content",			"Render different data to different layers"												},
		{ TEST_TYPE_LAYER_ID,						"fragment_layer",					"Read gl_Layer in fragment shader"														},
		{ TEST_TYPE_INVOCATION_PER_LAYER,			"invocation_per_layer",				"Render to multiple layers with multiple invocations, one invocation per layer"			},
		{ TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION,	"multiple_layers_per_invocation",	"Render to multiple layers with multiple invocations, multiple layers per invocation",	},
	};

	const ImageParams imageParams[] =
	{
		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		{ 64,  1, 1 },	4	},
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		{ 64, 64, 1 },	4	},
		{ VK_IMAGE_VIEW_TYPE_CUBE,			{ 64, 64, 1 },	6	},
		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	{ 64, 64, 1 },	2*6	},
		{ VK_IMAGE_VIEW_TYPE_3D,			{ 64, 64, 8 },	1	}
	};

	for (int imageParamNdx = 0; imageParamNdx < DE_LENGTH_OF_ARRAY(imageParams); ++imageParamNdx)
	{
		MovePtr<tcu::TestCaseGroup> viewTypeGroup(new tcu::TestCaseGroup(testCtx, getShortImageViewTypeName(imageParams[imageParamNdx].viewType).c_str(), ""));

		for (int testTypeNdx = 0; testTypeNdx < DE_LENGTH_OF_ARRAY(testTypes); ++testTypeNdx)
		{
			const TestParams params =
			{
				testTypes[testTypeNdx].test,
				imageParams[imageParamNdx],
			};
			addFunctionCaseWithPrograms(viewTypeGroup.get(), testTypes[testTypeNdx].name, testTypes[testTypeNdx].description, initPrograms, test, params);
		}

		group->addChild(viewTypeGroup.release());
	}

	return group.release();
}